

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

trap_kind_conflict * lookup_trap(char *desc)

{
  bitflag *pbVar1;
  int iVar2;
  char *pcVar3;
  trap_kind_conflict *ptVar4;
  long lVar5;
  angband_constants *paVar6;
  ulong uVar7;
  trap_kind_conflict *local_40;
  
  if (z_info->trap_max < 2) {
    local_40 = (trap_kind_conflict *)0x0;
  }
  else {
    uVar7 = 1;
    lVar5 = 0x80;
    local_40 = (trap_kind_conflict *)0x0;
    ptVar4 = trap_info;
    paVar6 = z_info;
    do {
      if (*(long *)(ptVar4->flags + lVar5 + -0x68) != 0) {
        pbVar1 = ptVar4->flags;
        pcVar3 = *(char **)(ptVar4->flags + lVar5 + -0x58);
        iVar2 = strcmp(desc,pcVar3);
        if (iVar2 == 0) {
          return (trap_kind_conflict *)(pbVar1 + lVar5 + -0x68);
        }
        if ((local_40 == (trap_kind_conflict *)0x0) &&
           (pcVar3 = my_stristr(pcVar3,desc), ptVar4 = trap_info, paVar6 = z_info,
           local_40 = (trap_kind_conflict *)(pbVar1 + lVar5 + -0x68), pcVar3 == (char *)0x0)) {
          local_40 = (trap_kind_conflict *)0x0;
        }
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x80;
    } while (uVar7 < paVar6->trap_max);
  }
  return local_40;
}

Assistant:

struct trap_kind *lookup_trap(const char *desc)
{
	int i;
	struct trap_kind *closest = NULL;

	/* Look for it */
	for (i = 1; i < z_info->trap_max; i++) {
		struct trap_kind *kind = &trap_info[i];
		if (!kind->name)
			continue;

		/* Test for equality */
		if (streq(desc, kind->desc))
			return kind;

		/* Test for close matches */
		if (!closest && my_stristr(kind->desc, desc))
			closest = kind;
	}

	/* Return our best match */
	return closest;
}